

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O1

void __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>
::solver_random_inequalities_101coeff
          (solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  sparse_matrix<int> *this_00;
  uint uVar1;
  int iVar2;
  pointer pmVar3;
  pointer pfVar4;
  undefined1 auVar5 [16];
  int *piVar6;
  ulong uVar7;
  rc_data *prVar8;
  bound_factor *pbVar9;
  longdouble *plVar10;
  undefined8 extraout_RAX;
  pointer *ppfVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  pointer pfVar18;
  uint *puVar19;
  void *pvVar20;
  
  this->rng = rng_;
  this_00 = &this->ap;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(this_00,csts,m_,n_);
  uVar13 = (ulong)(this->ap).m_rows_values.m_length;
  uVar7 = uVar13 * 4;
  piVar6 = (int *)operator_new__(uVar7);
  memset(piVar6,0,uVar7);
  (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = piVar6;
  pmVar3 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (long)*(pointer *)
                 ((long)&(pmVar3->elements).
                         super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                         ._M_impl + 8) -
          *(long *)&(pmVar3->elements).
                    super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                    ._M_impl >> 3;
  lVar12 = (long)(csts->
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar3;
  if (lVar12 != 0x28) {
    lVar12 = (lVar12 >> 3) * -0x3333333333333333 + -1;
    ppfVar11 = (pointer *)
               ((long)&pmVar3[1].elements.
                       super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                       ._M_impl + 8);
    do {
      uVar15 = (long)*ppfVar11 - (long)((_Vector_impl_data *)(ppfVar11 + -1))->_M_start >> 3;
      if (uVar7 <= uVar15) {
        uVar7 = uVar15;
      }
      ppfVar11 = ppfVar11 + 5;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  uVar7 = -(ulong)(uVar7 >> 0x3b != 0) | uVar7 << 5;
  prVar8 = (rc_data *)operator_new__(uVar7);
  memset(prVar8,0,uVar7);
  (this->R)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data_*,_false>
  ._M_head_impl = prVar8;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)m_;
  uVar7 = SUB168(auVar5 * ZEXT816(0xc),0);
  if (SUB168(auVar5 * ZEXT816(0xc),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pbVar9 = (bound_factor *)operator_new__(uVar7);
  memset(pbVar9,0,uVar7);
  (this->b)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::bound_factor[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::bound_factor[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::bound_factor_*,_false>
  ._M_head_impl = pbVar9;
  uVar7 = (long)m_ << 4;
  if (m_ < 0) {
    uVar7 = 0xffffffffffffffff;
  }
  plVar10 = (longdouble *)operator_new__(uVar7);
  memset(plVar10,0,uVar7);
  (this->pi)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
  super__Head_base<0UL,_long_double_*,_false>._M_head_impl = plVar10;
  uVar13 = uVar13 << 4;
  plVar10 = (longdouble *)operator_new__(uVar13);
  pvVar20 = (void *)0x0;
  memset(plVar10,0,uVar13);
  (this->P)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
  super__Head_base<0UL,_long_double_*,_false>._M_head_impl = plVar10;
  this->c = c_;
  (this->dist)._M_param._M_p = 0.5;
  this->m = m_;
  this->n = n_;
  pmVar3 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar7 = ((long)(csts->
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar3 >> 3) *
          -0x3333333333333333;
  if ((int)uVar7 != 0) {
    uVar13 = 0;
    do {
      pfVar18 = *(pointer *)
                 &pmVar3[uVar13].elements.
                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                  ._M_impl;
      pfVar4 = *(pointer *)
                ((long)&pmVar3[uVar13].elements.
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl + 8);
      if (pfVar18 == pfVar4) {
        iVar14 = 0;
        iVar16 = 0;
      }
      else {
        puVar19 = (uint *)(piVar6 + (int)pvVar20);
        iVar16 = 0;
        iVar14 = 0;
        do {
          uVar1 = pfVar18->factor;
          this = (solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>
                  *)(ulong)uVar1;
          if ((uVar1 + 1 & 0xfffffffd) != 0) {
            itm::solver_random_inequalities_101coeff();
            goto LAB_001a00ef;
          }
          *puVar19 = uVar1;
          uVar1 = (uint)(0 < pfVar18->factor);
          this = (solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>
                  *)(ulong)uVar1;
          iVar14 = iVar14 + uVar1;
          iVar16 = iVar16 + (uint)(pfVar18->factor < 1);
          pfVar18 = pfVar18 + 1;
          puVar19 = puVar19 + 1;
          pvVar20 = (void *)(ulong)((int)pvVar20 + 1);
        } while (pfVar18 != pfVar4);
      }
      iVar2 = pmVar3[uVar13].min;
      iVar17 = pmVar3[uVar13].max;
      if (iVar2 == iVar17) {
        pbVar9[uVar13].min = iVar2;
        iVar14 = iVar17;
      }
      else {
        iVar17 = -iVar16;
        if (iVar2 != iVar17 && SBORROW4(iVar2,iVar17) == iVar2 + iVar16 < 0) {
          iVar17 = iVar2;
        }
        pbVar9[uVar13].min = iVar17;
        if (pmVar3[uVar13].max < iVar14) {
          iVar14 = pmVar3[uVar13].max;
        }
      }
      pbVar9[uVar13].max = iVar14;
      if (iVar14 < pbVar9[uVar13].min) {
LAB_001a00ef:
        itm::solver_random_inequalities_101coeff();
        operator_delete__(pvVar20);
        (this->pi)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t
        .super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
        super__Head_base<0UL,_long_double_*,_false>._M_head_impl = (longdouble *)0x0;
        pbVar9 = (this->b)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::bound_factor[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::bound_factor[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::bound_factor_*,_false>
                 ._M_head_impl;
        if (pbVar9 != (bound_factor *)0x0) {
          operator_delete__(pbVar9);
        }
        (this->b)._M_t.
        super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::bound_factor[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::bound_factor[]>_>
        .
        super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::bound_factor_*,_false>
        ._M_head_impl = (bound_factor *)0x0;
        prVar8 = (this->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data_*,_false>
                 ._M_head_impl;
        if (prVar8 != (rc_data *)0x0) {
          operator_delete__(prVar8);
        }
        (this->R)._M_t.
        super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data[]>_>
        .
        super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<long_double>_>::rc_data_*,_false>
        ._M_head_impl = (rc_data *)0x0;
        piVar6 = (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
        if (piVar6 != (int *)0x0) {
          operator_delete__(piVar6);
        }
        (this->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)0x0;
        sparse_matrix<int>::~sparse_matrix(this_00);
        _Unwind_Resume(extraout_RAX);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uVar7 & 0xffffffff));
  }
  return;
}

Assistant:

solver_random_inequalities_101coeff(
      random_engine& rng_,
      int m_,
      int n_,
      const cost_type& c_,
      const std::vector<merged_constraint>& csts)
      : rng(rng_)
      , ap(csts, m_, n_)
      , A(std::make_unique<int[]>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , P(std::make_unique<Float[]>(ap.size()))
      , c(c_)
      , dist(0.5)
      , m(m_)
      , n(n_)
    {
        int id = 0;
        for (int i = 0, e = length(csts); i != e; ++i) {
            int lower = 0, upper = 0;

            for (const auto& cst : csts[i].elements) {
                bx_ensures(std::abs(cst.factor) == 1);
                A[id++] = cst.factor;

                if (cst.factor > 0)
                    upper++;
                else
                    lower++;
            }

            if (csts[i].min == csts[i].max) {
                b[i].min = csts[i].min;
                b[i].max = csts[i].max;
            } else {
                b[i].min = std::max(-lower, csts[i].min);
                b[i].max = std::min(upper, csts[i].max);
            }

            bx_ensures(b[i].min <= b[i].max);
        }
    }